

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DecorationManager::WhileEachDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration,
          function<bool_(const_spvtools::opt::Instruction_&)> *f)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  pointer ppIVar5;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  local_48;
  uint uVar4;
  
  InternalGetDecorationsFor<spvtools::opt::Instruction_const*>(&local_48,this,id,true);
  for (ppIVar5 = local_48.
                 super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar5 !=
      local_48.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar5 = ppIVar5 + 1) {
    this_00 = *ppIVar5;
    OVar1 = this_00->opcode_;
    if ((int)OVar1 < 0x14c) {
      if (OVar1 == OpDecorate) goto LAB_0055b22f;
      if (OVar1 != OpMemberDecorate) goto LAB_0055b29e;
      uVar4 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar4 = (uint)this_00->has_result_id_;
      }
      uVar3 = uVar4 + 2;
    }
    else {
      if ((OVar1 != OpDecorateId) && (OVar1 != OpDecorateString)) {
LAB_0055b29e:
        __assert_fail("false && \"Unexpected decoration instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x1e0,
                      "bool spvtools::opt::analysis::DecorationManager::WhileEachDecoration(uint32_t, uint32_t, std::function<bool (const Instruction &)>) const"
                     );
      }
LAB_0055b22f:
      uVar4 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar4 = (uint)this_00->has_result_id_;
      }
      uVar3 = uVar4 + 1;
    }
    uVar3 = Instruction::GetSingleWordOperand(this_00,uVar3);
    if (uVar3 == decoration) {
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (*f->_M_invoker)((_Any_data *)f,this_00);
      if (!bVar2) break;
    }
  }
  if (local_48.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppIVar5 ==
         local_48.
         super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool DecorationManager::WhileEachDecoration(
    uint32_t id, uint32_t decoration,
    std::function<bool(const Instruction&)> f) const {
  for (const Instruction* inst : GetDecorationsFor(id, true)) {
    switch (inst->opcode()) {
      case spv::Op::OpMemberDecorate:
        if (inst->GetSingleWordInOperand(2) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpDecorateStringGOOGLE:
        if (inst->GetSingleWordInOperand(1) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
  return true;
}